

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsAdvDiff_ASAi_bnd.c
# Opt level: O2

int main(int argc,char **argv)

{
  double dVar1;
  int iVar2;
  double *returnvalue;
  void *pvVar3;
  long lVar4;
  void *returnvalue_00;
  void *returnvalue_01;
  void *pvVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  double dVar9;
  int retval;
  int indexB;
  SUNContext sunctx;
  void *local_90;
  double local_88;
  double local_80;
  double local_78;
  int ncheck;
  double local_68;
  undefined8 uStack_60;
  void *local_58;
  void *local_50;
  double local_48;
  sunrealtype t;
  void *local_38;
  
  returnvalue = (double *)malloc(0x28);
  iVar2 = check_retval(returnvalue,"malloc",2);
  if (iVar2 == 0) {
    *returnvalue = 0.04878048780487805;
    returnvalue[1] = 0.047619047619047616;
    *(undefined4 *)(returnvalue + 2) = 0;
    *(undefined4 *)((long)returnvalue + 0x14) = 0x407a4400;
    *(undefined4 *)(returnvalue + 3) = 0;
    *(undefined4 *)((long)returnvalue + 0x1c) = 0x402ec000;
    returnvalue[4] = 441.00000000000006;
    retval = SUNContext_Create(0,&sunctx);
    iVar2 = check_retval(&retval,"SUNContext_Create",1);
    if (iVar2 != 0) {
      return 1;
    }
    pvVar3 = (void *)N_VNew_Serial(800,sunctx);
    iVar2 = check_retval(pvVar3,"N_VNew",0);
    if (iVar2 != 0) {
      return 1;
    }
    local_88 = *returnvalue;
    local_78 = returnvalue[1];
    local_50 = pvVar3;
    lVar4 = N_VGetArrayPointer(pvVar3);
    for (lVar6 = 1; lVar6 != 0x15; lVar6 = lVar6 + 1) {
      local_90 = (void *)((double)(int)lVar6 * local_78);
      local_80 = 1.0 - (double)local_90;
      iVar2 = 1;
      for (lVar7 = -0x1900; lVar7 != 0; lVar7 = lVar7 + 0xa0) {
        dVar1 = (double)iVar2 * local_88;
        local_68 = (2.0 - dVar1) * dVar1 * (double)local_90 * local_80;
        dVar1 = exp(dVar1 * 5.0 * (double)local_90);
        *(double *)(lVar4 + 0x1900 + lVar7) = dVar1 * local_68;
        iVar2 = iVar2 + 1;
      }
      lVar4 = lVar4 + 8;
    }
    puts("\nCreate and allocate CVODES memory for forward runs");
    pvVar3 = (void *)CVodeCreate(2,sunctx);
    local_38 = pvVar3;
    iVar2 = check_retval(pvVar3,"CVodeCreate",0);
    if (iVar2 == 0) {
      retval = CVodeSetUserData(pvVar3,returnvalue);
      iVar2 = check_retval(&retval,"CVodeSetUserData",1);
      pvVar5 = local_50;
      if (iVar2 != 0) {
        return 1;
      }
      retval = CVodeInit(0,pvVar3,f,local_50);
      iVar2 = check_retval(&retval,"CVodeInit",1);
      if (iVar2 != 0) {
        return 1;
      }
      retval = CVodeSStolerances(0,0x3ee4f8b588e368f1,pvVar3);
      iVar2 = check_retval(&retval,"CVodeSStolerances",1);
      if (iVar2 != 0) {
        return 1;
      }
      returnvalue_00 = (void *)SUNBandMatrix(800,0x14,0x14,sunctx);
      iVar2 = check_retval(returnvalue_00,"SUNBandMatrix",0);
      if (iVar2 != 0) {
        return 1;
      }
      returnvalue_01 = (void *)SUNLinSol_Band(pvVar5,returnvalue_00,sunctx);
      iVar2 = check_retval(returnvalue_01,"SUNLinSol_Band",0);
      if (iVar2 != 0) {
        return 1;
      }
      retval = CVodeSetLinearSolver(pvVar3,returnvalue_01,returnvalue_00);
      iVar2 = check_retval(&retval,"CVodeSetLinearSolver",1);
      if (iVar2 != 0) {
        return 1;
      }
      retval = CVodeSetJacFn(pvVar3,Jac);
      iVar2 = check_retval(&retval,"CVodeSetJacFn",1);
      if (iVar2 != 0) {
        return 1;
      }
      puts("\nAllocate global memory");
      retval = CVodeAdjInit(pvVar3,0x32,1);
      iVar2 = check_retval(&retval,"CVodeAdjInit",1);
      if (iVar2 != 0) {
        return 1;
      }
      puts("\nForward integration");
      retval = CVodeF(0,pvVar3,pvVar5,&t,1,&ncheck);
      iVar2 = check_retval(&retval,"CVodeF",1);
      if (iVar2 != 0) {
        return 1;
      }
      printf("\nncheck = %d\n",(ulong)(uint)ncheck);
      pvVar5 = (void *)N_VNew_Serial(800,sunctx);
      iVar2 = check_retval(pvVar5,"N_VNew",0);
      if (iVar2 != 0) {
        return 1;
      }
      N_VConst(0,pvVar5);
      puts("\nCreate and allocate CVODES memory for backward run");
      retval = CVodeCreateB(pvVar3,2,&indexB);
      iVar2 = check_retval(&retval,"CVodeCreateB",1);
      if (iVar2 != 0) {
        return 1;
      }
      retval = CVodeSetUserDataB(pvVar3,indexB,returnvalue);
      iVar2 = check_retval(&retval,"CVodeSetUserDataB",1);
      if (iVar2 != 0) {
        return 1;
      }
      retval = CVodeInitB(0,pvVar3,indexB,fB,pvVar5);
      iVar2 = check_retval(&retval,"CVodeInitB",1);
      if (iVar2 != 0) {
        return 1;
      }
      retval = CVodeSStolerancesB(0xa0b5ed8d,pvVar3,indexB);
      iVar2 = check_retval(&retval,"CVodeSStolerancesB",1);
      if (iVar2 != 0) {
        return 1;
      }
      local_90 = (void *)SUNBandMatrix(800,0x14,0x14,sunctx);
      iVar2 = check_retval(local_90,"SUNBandMatrix",0);
      if (iVar2 != 0) {
        return 1;
      }
      local_58 = (void *)SUNLinSol_Band(pvVar5,local_90,sunctx);
      iVar2 = check_retval(local_58,"SUNLinSol_Band",0);
      if (iVar2 != 0) {
        return 1;
      }
      retval = CVodeSetLinearSolverB(pvVar3,indexB,local_58,local_90);
      iVar2 = check_retval(&retval,"CVodeSetLinearSolverB",1);
      if (iVar2 != 0) {
        return 1;
      }
      retval = CVodeSetJacFnB(pvVar3,indexB,JacB);
      iVar2 = check_retval(&retval,"CVodeSetJacFnB",1);
      if (iVar2 != 0) {
        return 1;
      }
      puts("\nBackward integration");
      retval = CVodeB(0,pvVar3,1);
      iVar2 = check_retval(&retval,"CVodeB",1);
      if (iVar2 != 0) {
        return 1;
      }
      retval = CVodeGetB(pvVar3,indexB,&t,pvVar5);
      iVar2 = check_retval(&retval,"CVodeGetB",1);
      if (iVar2 != 0) {
        return 1;
      }
      local_78 = *returnvalue;
      local_48 = returnvalue[1];
      lVar4 = N_VGetArrayPointer(pvVar5);
      local_80 = 0.0;
      local_88 = 0.0;
      local_68 = 0.0;
      for (lVar6 = 1; uStack_60 = 0, lVar6 != 0x15; lVar6 = lVar6 + 1) {
        iVar2 = 1;
        for (lVar7 = -0x1900; lVar7 != 0; lVar7 = lVar7 + 0xa0) {
          dVar1 = *(double *)(lVar4 + 0x1900 + lVar7);
          dVar9 = ABS(dVar1);
          if (local_68 < dVar9) {
            local_88 = (double)iVar2 * local_78;
            local_80 = (double)(int)lVar6 * local_48;
          }
          uVar8 = -(ulong)(local_68 < dVar9);
          local_68 = (double)(~uVar8 & (ulong)local_68 | (ulong)dVar1 & uVar8);
          iVar2 = iVar2 + 1;
        }
        lVar4 = lVar4 + 8;
      }
      puts("\nMaximum sensitivity");
      printf("  lambda max = %e\n",local_68._0_4_);
      puts("at");
      printf("  x = %e\n  y = %e\n",SUB84(local_88,0),local_80);
      N_VDestroy(local_50);
      N_VDestroy(pvVar5);
      CVodeFree(&local_38);
      SUNLinSolFree(returnvalue_01);
      SUNMatDestroy(returnvalue_00);
      SUNLinSolFree(local_58);
      SUNMatDestroy(local_90);
      free(returnvalue);
      SUNContext_Free(&sunctx);
      return 0;
    }
  }
  return 1;
}

Assistant:

int main(int argc, char* argv[])
{
  SUNContext sunctx;
  UserData data;

  void* cvode_mem;
  SUNMatrix A, AB;
  SUNLinearSolver LS, LSB;

  sunrealtype dx, dy, reltol, abstol, t;
  N_Vector u;

  int indexB;

  sunrealtype reltolB, abstolB;
  N_Vector uB;

  int retval, ncheck;

  data      = NULL;
  cvode_mem = NULL;
  u = uB = NULL;
  LS = LSB = NULL;
  A = AB = NULL;

  /* Allocate and initialize user data memory */

  data = (UserData)malloc(sizeof *data);
  if (check_retval((void*)data, "malloc", 2)) { return (1); }

  dx = data->dx = XMAX / (MX + 1);
  dy = data->dy = YMAX / (MY + 1);
  data->hdcoef  = ONE / (dx * dx);
  data->hacoef  = SUN_RCONST(1.5) / (TWO * dx);
  data->vdcoef  = ONE / (dy * dy);

  /* Set the tolerances for the forward integration */
  reltol = ZERO;
  abstol = ATOL;

  /* Create the SUNDIALS simulation context that all SUNDIALS objects require */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* Allocate u vector */
  u = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)u, "N_VNew", 0)) { return (1); }

  /* Initialize u vector */
  SetIC(u, data);

  /* Create and allocate CVODES memory for forward run */

  printf("\nCreate and allocate CVODES memory for forward runs\n");

  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }

  retval = CVodeSetUserData(cvode_mem, data);
  if (check_retval(&retval, "CVodeSetUserData", 1)) { return (1); }

  retval = CVodeInit(cvode_mem, f, T0, u);
  if (check_retval(&retval, "CVodeInit", 1)) { return (1); }

  retval = CVodeSStolerances(cvode_mem, reltol, abstol);
  if (check_retval(&retval, "CVodeSStolerances", 1)) { return (1); }

  /* Create banded SUNMatrix for the forward problem */
  A = SUNBandMatrix(NEQ, MY, MY, sunctx);
  if (check_retval((void*)A, "SUNBandMatrix", 0)) { return (1); }

  /* Create banded SUNLinearSolver for the forward problem */
  LS = SUNLinSol_Band(u, A, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_Band", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = CVodeSetLinearSolver(cvode_mem, LS, A);
  if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return (1); }

  /* Set the user-supplied Jacobian routine for the forward problem */
  retval = CVodeSetJacFn(cvode_mem, Jac);
  if (check_retval(&retval, "CVodeSetJacFn", 1)) { return (1); }

  /* Allocate global memory */

  printf("\nAllocate global memory\n");

  retval = CVodeAdjInit(cvode_mem, NSTEP, CV_HERMITE);
  if (check_retval(&retval, "CVodeAdjInit", 1)) { return (1); }

  /* Perform forward run */
  printf("\nForward integration\n");
  retval = CVodeF(cvode_mem, TOUT, u, &t, CV_NORMAL, &ncheck);
  if (check_retval(&retval, "CVodeF", 1)) { return (1); }

  printf("\nncheck = %d\n", ncheck);

  /* Set the tolerances for the backward integration */
  reltolB = RTOLB;
  abstolB = ATOL;

  /* Allocate uB */
  uB = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)uB, "N_VNew", 0)) { return (1); }
  /* Initialize uB = 0 */
  N_VConst(ZERO, uB);

  /* Create and allocate CVODES memory for backward run */

  printf("\nCreate and allocate CVODES memory for backward run\n");

  retval = CVodeCreateB(cvode_mem, CV_BDF, &indexB);
  if (check_retval(&retval, "CVodeCreateB", 1)) { return (1); }

  retval = CVodeSetUserDataB(cvode_mem, indexB, data);
  if (check_retval(&retval, "CVodeSetUserDataB", 1)) { return (1); }

  retval = CVodeInitB(cvode_mem, indexB, fB, TOUT, uB);
  if (check_retval(&retval, "CVodeInitB", 1)) { return (1); }

  retval = CVodeSStolerancesB(cvode_mem, indexB, reltolB, abstolB);
  if (check_retval(&retval, "CVodeSStolerancesB", 1)) { return (1); }

  /* Create banded SUNMatrix for the backward problem */
  AB = SUNBandMatrix(NEQ, MY, MY, sunctx);
  if (check_retval((void*)AB, "SUNBandMatrix", 0)) { return (1); }

  /* Create banded SUNLinearSolver for the backward problem */
  LSB = SUNLinSol_Band(uB, AB, sunctx);
  if (check_retval((void*)LSB, "SUNLinSol_Band", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = CVodeSetLinearSolverB(cvode_mem, indexB, LSB, AB);
  if (check_retval(&retval, "CVodeSetLinearSolverB", 1)) { return (1); }

  /* Set the user-supplied Jacobian routine for the backward problem */
  retval = CVodeSetJacFnB(cvode_mem, indexB, JacB);
  if (check_retval(&retval, "CVodeSetJacFnB", 1)) { return (1); }

  /* Perform backward integration */
  printf("\nBackward integration\n");
  retval = CVodeB(cvode_mem, T0, CV_NORMAL);
  if (check_retval(&retval, "CVodeB", 1)) { return (1); }

  retval = CVodeGetB(cvode_mem, indexB, &t, uB);
  if (check_retval(&retval, "CVodeGetB", 1)) { return (1); }

  PrintOutput(uB, data);

  N_VDestroy(u);            /* Free the u vector                      */
  N_VDestroy(uB);           /* Free the uB vector                     */
  CVodeFree(&cvode_mem);    /* Free the CVODE problem memory          */
  SUNLinSolFree(LS);        /* Free the forward linear solver memory  */
  SUNMatDestroy(A);         /* Free the forward matrix memory         */
  SUNLinSolFree(LSB);       /* Free the backward linear solver memory */
  SUNMatDestroy(AB);        /* Free the backward matrix memory        */
  free(data);               /* Free the user data */
  SUNContext_Free(&sunctx); /* Free the SUNDIALS simulation context */

  return (0);
}